

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O3

b_str<char32_t> *
detail::operator|(b_str<char32_t> *__return_storage_ptr__,b_str<char32_t> *str,
                 split_helper_subroutine<detail::split_at_first_back,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_char32_t>
                 *info)

{
  size_type sVar1;
  ulong uVar2;
  pointer pcVar3;
  pointer pcVar4;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar6;
  ulong uVar7;
  size_t __i;
  size_type sVar8;
  size_t __i_1;
  size_type sVar9;
  size_type *psVar10;
  
  sVar1 = (info->delim)._M_string_length;
  uVar2 = str->_M_string_length;
  if (uVar2 != 0 && sVar1 != 0) {
    pcVar3 = (info->delim)._M_dataplus._M_p;
    psVar10 = &str->_M_string_length;
    pcVar4 = (str->_M_dataplus)._M_p;
    uVar7 = 0;
    do {
      sVar8 = 0;
      do {
        if (pcVar3[sVar8] == pcVar4[uVar7]) {
          if (uVar7 == 0xffffffffffffffff) goto LAB_001b1987;
          sVar8 = 0xffffffffffffffff;
          if (uVar2 <= uVar7) goto LAB_001b199a;
          goto LAB_001b1966;
        }
        sVar8 = sVar8 + 1;
      } while (sVar1 != sVar8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar2);
  }
LAB_001b1987:
  paVar6 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar6;
  psVar10 = &__return_storage_ptr__->_M_string_length;
  goto LAB_001b19d4;
LAB_001b1966:
  do {
    sVar8 = uVar7;
    sVar9 = 0;
    while (pcVar3[sVar9] != pcVar4[sVar8]) {
      sVar9 = sVar9 + 1;
      if (sVar1 == sVar9) goto LAB_001b199a;
    }
    uVar7 = sVar8 + 1;
    sVar8 = 0xffffffffffffffff;
  } while (uVar7 != uVar2);
LAB_001b199a:
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::erase
            (str,0,sVar8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar3 = (str->_M_dataplus)._M_p;
  paVar6 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)pcVar3 == paVar6) {
    uVar5 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar5;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = str->_M_string_length;
  (str->_M_dataplus)._M_p = (pointer)paVar6;
LAB_001b19d4:
  *psVar10 = 0;
  paVar6->_M_local_buf[0] = L'\0';
  return __return_storage_ptr__;
}

Assistant:

b_str<CharType> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first_back, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return {};
		str.erase(0, str.find_first_not_of(info.delim, pos));
		return std::move(str);
	}